

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O0

void __thiscall TagParser::testCaseResultComplete(TagParser *this,TestCaseResultPtr *caseData)

{
  int iVar1;
  TestStatusCode TVar2;
  ParseResult PVar3;
  TestCaseResultData *pTVar4;
  char *pcVar5;
  size_type sVar6;
  deUint8 *bytes;
  const_reference tagName;
  reference pvVar7;
  Value VVar8;
  undefined4 uStack_104;
  int local_f8;
  int valNdx;
  ParseResult parseResult;
  TestCaseResult fullResult;
  undefined1 local_80 [8];
  CaseValues tagResult;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tagNames;
  TestCaseResultPtr *caseData_local;
  TagParser *this_local;
  
  tagResult.values.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)BatchResultValues::getTagNames_abi_cxx11_(this->m_result);
  CaseValues::CaseValues((CaseValues *)local_80);
  pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
  pcVar5 = xe::TestCaseResultData::getTestCasePath(pTVar4);
  std::__cxx11::string::operator=((string *)local_80,pcVar5);
  tagResult.casePath.field_2._8_4_ = 0;
  pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
  tagResult.casePath.field_2._12_4_ = xe::TestCaseResultData::getStatusCode(pTVar4);
  pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
  pcVar5 = xe::TestCaseResultData::getStatusDetails(pTVar4);
  std::__cxx11::string::operator=((string *)&tagResult.caseType,pcVar5);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)tagResult.values.
                    super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>::resize
            ((vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_> *)
             ((long)&tagResult.statusDetails.field_2 + 8),sVar6);
  pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
  iVar1 = xe::TestCaseResultData::getDataSize(pTVar4);
  if (0 < iVar1) {
    pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
    TVar2 = xe::TestCaseResultData::getStatusCode(pTVar4);
    if (TVar2 == TESTSTATUSCODE_LAST) {
      xe::TestCaseResult::TestCaseResult((TestCaseResult *)&valNdx);
      xe::TestResultParser::init(&this->m_testResultParser,(EVP_PKEY_CTX *)&valNdx);
      pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
      bytes = xe::TestCaseResultData::getData(pTVar4);
      pTVar4 = de::SharedPtr<xe::TestCaseResultData>::operator->(caseData);
      iVar1 = xe::TestCaseResultData::getDataSize(pTVar4);
      PVar3 = xe::TestResultParser::parse(&this->m_testResultParser,bytes,iVar1);
      if (((PVar3 == PARSERESULT_ERROR) ||
          (fullResult.super_TestCaseResultHeader.casePath.field_2._12_4_ == 0xe)) &&
         ((tagResult.casePath.field_2._12_4_ != 0xe ||
          (fullResult.super_TestCaseResultHeader.casePath.field_2._12_4_ == 0xe)))) {
        if (tagResult.casePath.field_2._12_4_ == 0xe) {
          tagResult.casePath.field_2._12_4_ = 8;
          std::__cxx11::string::operator=
                    ((string *)&tagResult.caseType,"Test case result parsing failed");
        }
      }
      else {
        tagResult.casePath.field_2._12_4_ =
             fullResult.super_TestCaseResultHeader.casePath.field_2._12_4_;
        std::__cxx11::string::operator=
                  ((string *)&tagResult.caseType,
                   (string *)&fullResult.super_TestCaseResultHeader.caseType);
      }
      if (PVar3 != PARSERESULT_ERROR) {
        for (local_f8 = 0;
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)tagResult.values.
                              super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
            local_f8 < (int)sVar6; local_f8 = local_f8 + 1) {
          tagName = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)tagResult.values.
                                    super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)local_f8);
          VVar8 = findValueByTag((List *)((long)&fullResult.super_TestCaseResultHeader.statusDetails
                                                 .field_2 + 8),tagName);
          pvVar7 = std::vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>::
                   operator[]((vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_> *
                              )((long)&tagResult.statusDetails.field_2 + 8),(long)local_f8);
          *(ulong *)pvVar7 = CONCAT44(uStack_104,VVar8.m_type);
          (pvVar7->m_value).int64 = (deInt64)VVar8.m_value;
        }
      }
      xe::TestCaseResult::~TestCaseResult((TestCaseResult *)&valNdx);
    }
  }
  BatchResultValues::add(this->m_result,(CaseValues *)local_80);
  CaseValues::~CaseValues((CaseValues *)local_80);
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& caseData)
	{
		const vector<string>&	tagNames	= m_result.getTagNames();
		CaseValues				tagResult;

		tagResult.casePath		= caseData->getTestCasePath();
		tagResult.caseType		= xe::TESTCASETYPE_SELF_VALIDATE;
		tagResult.statusCode	= caseData->getStatusCode();
		tagResult.statusDetails	= caseData->getStatusDetails();
		tagResult.values.resize(tagNames.size());

		if (caseData->getDataSize() > 0 && caseData->getStatusCode() == xe::TESTSTATUSCODE_LAST)
		{
			xe::TestCaseResult					fullResult;
			xe::TestResultParser::ParseResult	parseResult;

			m_testResultParser.init(&fullResult);
			parseResult = m_testResultParser.parse(caseData->getData(), caseData->getDataSize());

			if ((parseResult != xe::TestResultParser::PARSERESULT_ERROR && fullResult.statusCode != xe::TESTSTATUSCODE_LAST) ||
				(tagResult.statusCode == xe::TESTSTATUSCODE_LAST && fullResult.statusCode != xe::TESTSTATUSCODE_LAST))
			{
				tagResult.statusCode	= fullResult.statusCode;
				tagResult.statusDetails	= fullResult.statusDetails;
			}
			else if (tagResult.statusCode == xe::TESTSTATUSCODE_LAST)
			{
				DE_ASSERT(parseResult == xe::TestResultParser::PARSERESULT_ERROR);
				tagResult.statusCode	= xe::TESTSTATUSCODE_INTERNAL_ERROR;
				tagResult.statusDetails	= "Test case result parsing failed";
			}

			if (parseResult != xe::TestResultParser::PARSERESULT_ERROR)
			{
				for (int valNdx = 0; valNdx < (int)tagNames.size(); valNdx++)
					tagResult.values[valNdx] = findValueByTag(fullResult.resultItems, tagNames[valNdx]);
			}
		}

		m_result.add(tagResult);
	}